

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::
Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
::doWalkModule(Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               *this,Module *module)

{
  pointer puVar1;
  Global *pGVar2;
  pointer puVar3;
  Function *func;
  pointer puVar4;
  pointer puVar5;
  DataSegment *pDVar6;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr_1;
  pointer puVar7;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pGVar2 = (puVar8->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
      walk(this,&pGVar2->init);
    }
  }
  puVar7 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar3) {
    do {
      func = (puVar7->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(func->super_Importable).module + 8) == (char *)0x0) {
        this->currFunction = func;
        SimplifyLocals<false,_false,_true>::doWalkFunction
                  ((SimplifyLocals<false,_false,_true> *)&this[-1].stack.fixed._M_elems[9].currp,
                   func);
        this->currFunction = (Function *)0x0;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  puVar4 = (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (module->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    walkElementSegment(this,(puVar9->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  }
  puVar5 = (module->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (module->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar5; puVar10 = puVar10 + 1
      ) {
    pDVar6 = (puVar10->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar6->isPassive == false) {
      walk(this,&pDVar6->offset);
    }
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Dispatch statically through the SubType.
    SubType* self = static_cast<SubType*>(this);
    for (auto& curr : module->exports) {
      self->visitExport(curr.get());
    }
    for (auto& curr : module->globals) {
      if (curr->imported()) {
        self->visitGlobal(curr.get());
      } else {
        self->walkGlobal(curr.get());
      }
    }
    for (auto& curr : module->functions) {
      if (curr->imported()) {
        self->visitFunction(curr.get());
      } else {
        self->walkFunction(curr.get());
      }
    }
    for (auto& curr : module->tags) {
      if (curr->imported()) {
        self->visitTag(curr.get());
      } else {
        self->walkTag(curr.get());
      }
    }
    for (auto& curr : module->tables) {
      self->walkTable(curr.get());
    }
    for (auto& curr : module->elementSegments) {
      self->walkElementSegment(curr.get());
    }
    for (auto& curr : module->memories) {
      self->walkMemory(curr.get());
    }
    for (auto& curr : module->dataSegments) {
      self->walkDataSegment(curr.get());
    }
  }